

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode UA_EndpointUrl_split(char *endpointUrl,char *hostname,UA_UInt16 *port,char **path)

{
  char cVar1;
  byte bVar2;
  char *__src;
  uint uVar3;
  UA_StatusCode UVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  char *__n;
  char *local_48;
  char *portTmp;
  char *pathTmp;
  char portStr [6];
  
  local_48 = (char *)0x0;
  portTmp = (char *)0x0;
  UVar4 = UA_EndpointUrl_split_ptr(endpointUrl,hostname,&local_48,&portTmp);
  __src = local_48;
  if (UVar4 != 0) {
    if (hostname == (char *)0x0) {
      return UVar4;
    }
    *hostname = '\0';
    return UVar4;
  }
  if (port == (UA_UInt16 *)0x0 && path == (char **)0x0) {
    return 0;
  }
  pathTmp._2_1_ = 0;
  if (local_48 == (char *)0x0) {
    if (port == (UA_UInt16 *)0x0) goto LAB_001141d5;
    uVar7 = 0;
  }
  else {
    if (portTmp == (char *)0x0) {
      __n = (char *)strlen(local_48);
    }
    else {
      __n = portTmp + ~(ulong)local_48;
    }
    if ((char *)0x5 < __n) {
      return 0x803c0000;
    }
    memcpy((void *)((long)&pathTmp + 2),__src,(size_t)__n);
    __n[(long)&pathTmp + 2] = '\0';
    if (port == (UA_UInt16 *)0x0) goto LAB_001141d5;
    lVar5 = 0;
    do {
      cVar1 = *(char *)((long)&pathTmp + lVar5 + 2);
      if (cVar1 == '\0') break;
      if ((byte)(cVar1 - 0x3aU) < 0xf6) {
        return 0x803c0000;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    uVar6 = 0;
    uVar3 = 0;
    do {
      uVar7 = uVar3;
      if (5 < uVar6) break;
      bVar2 = *(byte *)((long)&pathTmp + uVar6 + 2);
      uVar6 = uVar6 + 1;
      uVar3 = ((uint)bVar2 + uVar7 * 10) - 0x30;
    } while ((byte)(bVar2 - 0x30) < 10);
    if (0xffff < uVar7) {
      return 0x803c0000;
    }
  }
  *port = (UA_UInt16)uVar7;
LAB_001141d5:
  if (path != (char **)0x0) {
    *path = portTmp;
  }
  return 0;
}

Assistant:

UA_StatusCode
UA_EndpointUrl_split(const char *endpointUrl, char *hostname,
                     UA_UInt16 * port, const char ** path) {
    const char* portTmp = NULL;
    const char* pathTmp = NULL;
    UA_StatusCode retval = UA_EndpointUrl_split_ptr(endpointUrl, hostname, &portTmp, &pathTmp);
    if(retval != UA_STATUSCODE_GOOD) {
        if(hostname)
            hostname[0] = '\0';
        return retval;
    }
    if(!port && !path)
        return UA_STATUSCODE_GOOD;

    char portStr[6];
    portStr[0] = '\0';
    if(portTmp) {
        size_t portLen;
        if (pathTmp)
            portLen = (size_t)(pathTmp-portTmp-1);
        else
            portLen = strlen(portTmp);

        if (portLen > 5) // max is 65535
            return UA_STATUSCODE_BADOUTOFRANGE;

        memcpy(portStr, portTmp, portLen);
        portStr[portLen]='\0';

        if(port) {
            for (size_t i=0; i<6; ++i) {
                if (portStr[i] == 0)
                    break;
                if (portStr[i] < '0' || portStr[i] > '9')
                    return UA_STATUSCODE_BADOUTOFRANGE;
            }

            UA_UInt32 p;
            UA_readNumber((UA_Byte*)portStr, 6, &p);
            if (p>65535)
                return UA_STATUSCODE_BADOUTOFRANGE;
            *port = (UA_UInt16)p;
        }
    } else {
        if (port)
            *port = 0;
    }
    if (path)
        *path = pathTmp;
    return UA_STATUSCODE_GOOD;
}